

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

SUNErrCode
N_VWrmsNormMaskVectorArray_ManyVector(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  long lVar1;
  sunrealtype sVar2;
  double __x;
  double dVar3;
  
  if (0 < nvec) {
    lVar1 = 0;
    do {
      sVar2 = (sunrealtype)N_VWSqrSumMaskLocal(X[lVar1],W[lVar1],id);
      nrm[lVar1] = sVar2;
      lVar1 = lVar1 + 1;
    } while (nvec != lVar1);
    if (0 < nvec) {
      lVar1 = 0;
      do {
        __x = nrm[lVar1] / (double)*(long *)((long)X[lVar1]->content + 8);
        dVar3 = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar3 = sqrt(__x);
          }
          else {
            dVar3 = SQRT(__x);
          }
        }
        nrm[lVar1] = dVar3;
        lVar1 = lVar1 + 1;
      } while (nvec != lVar1);
    }
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VWrmsNormMaskVectorArray)(int nvec, N_Vector* X,
                                                N_Vector* W, N_Vector id,
                                                sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);

  sunindextype i;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* call N_VWSqrSumMaskLocal for each (X[i],W[i]) pair */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = N_VWSqrSumMaskLocal(X[i], W[i], id);
    SUNCheckLastErr();
  }

  /* accumulate totals */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(X[0]) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, nrm, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(X[0])));
  }
#endif

  /* finish off WRMS norms and return */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = SUNRsqrt(nrm[i] / (MANYVECTOR_GLOBLENGTH(X[i])));
  }

  return SUN_SUCCESS;
}